

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86_avx::forward
          (Convolution_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int i;
  int i_00;
  int iVar2;
  pointer pMVar3;
  int *piVar4;
  long *plVar5;
  Layer *pLVar6;
  long lVar7;
  int iVar8;
  ParamDict pd;
  Mat local_178;
  Mat local_128;
  pointer local_e0;
  ModelBinFromMatArray local_d8;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  int local_68;
  Allocator *local_60;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  size_t local_40;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_e0 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
  iVar1 = pMVar3[1].elempack;
  i = pMVar3[1].w;
  i_00 = pMVar3[1].h;
  iVar2 = pMVar3[1].c;
  local_128.cstep = 0;
  local_128.data = (void *)0x0;
  local_128.refcount._0_4_ = 0;
  local_128.refcount._4_4_ = 0;
  local_128.elemsize._0_4_ = 0;
  local_128.elemsize._4_4_ = 0;
  local_128.elempack = 0;
  local_128.allocator = (Allocator *)0x0;
  local_128.dims = 0;
  local_128.w = 0;
  local_128.h = 0;
  local_128.d = 0;
  local_128.c = 0;
  flatten(pMVar3 + 1,&local_128,opt);
  iVar8 = -100;
  local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
  local_128.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_128.data == (void *)0x0) ||
     (local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize),
     local_128.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_128.c * local_128.cstep == 0)) goto LAB_00225724;
  local_128.w = local_128.w * local_128.elempack;
  local_128.elemsize =
       CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) /
       (ulong)(long)local_128.elempack;
  local_128.elempack = 1;
  local_178.cstep = 0;
  local_178.data = (void *)0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elemsize = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  if (*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x10 +
              (long)&(this->weight_winograd43_data).data) == 0) {
LAB_0022528a:
    pLVar6 = create_layer(6);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,iVar1 * iVar2);
    ParamDict::set(&pd,1,i);
    ParamDict::set(&pd,0xb,i_00);
    ParamDict::set(&pd,2,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x34 +
                                 (long)&(this->weight_winograd23_data).data));
    ParamDict::set(&pd,0x15,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x38 +
                                    (long)&(this->weight_winograd23_data).data));
    ParamDict::set(&pd,3,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x3c +
                                 (long)&(this->weight_winograd23_data).data));
    ParamDict::set(&pd,0x1f,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x40 +
                                    (long)&(this->weight_winograd23_data).data));
    ParamDict::set(&pd,4,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x44 +
                                 (long)&(this->weight_winograd23_data).data));
    ParamDict::set(&pd,0xf,*(int *)(this->_vptr_Convolution_x86_avx[-3] +
                                   (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,0xe,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 4 +
                                   (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,0x10,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 8 +
                                    (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,0x12,*(float *)(this->_vptr_Convolution_x86_avx[-3] + 0xc +
                                      (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,5,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x10 +
                                 (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,6,local_128.w);
    ParamDict::set(&pd,8,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x18 +
                                 (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,9,*(int *)(this->_vptr_Convolution_x86_avx[-3] + 0x1c +
                                 (long)&(this->weight_winograd43_data).data));
    ParamDict::set(&pd,10,(Mat *)(this->_vptr_Convolution_x86_avx[-3] + 0x20 +
                                 (long)&(this->weight_winograd43_data).data));
    (*pLVar6->_vptr_Layer[2])(pLVar6,&pd);
    piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    local_c8.cstep = local_128.cstep;
    local_c8.c = local_128.c;
    local_c8.d = local_128.d;
    local_c8.h = local_128.h;
    local_c8.w = local_128.w;
    local_c8.dims = local_128.dims;
    local_c8.allocator = local_128.allocator;
    local_c8.elempack = local_128.elempack;
    local_c8.elemsize = local_128.elemsize;
    local_c8.refcount._4_4_ = local_128.refcount._4_4_;
    local_c8.refcount._0_4_ = local_128.refcount._0_4_;
    local_c8.data = local_128.data;
    local_70 = local_178.elemsize;
    local_80 = local_178.data;
    uStack_78 = local_178.refcount._0_4_;
    uStack_74 = local_178.refcount._4_4_;
    local_68 = local_178.elempack;
    local_60 = local_178.allocator;
    iStack_58 = local_178.dims;
    iStack_54 = local_178.w;
    iStack_50 = local_178.h;
    iStack_4c = local_178.d;
    local_48 = local_178.c;
    local_40 = local_178.cstep;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_d8,&local_c8);
    (*pLVar6->_vptr_Layer[3])(pLVar6,&local_d8);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_d8);
    (*pLVar6->_vptr_Layer[4])(pLVar6,opt);
    (*pLVar6->_vptr_Layer[7])(pLVar6,pMVar3,local_e0,opt);
    (*pLVar6->_vptr_Layer[5])(pLVar6,opt);
    (*pLVar6->_vptr_Layer[1])(pLVar6);
    lVar7 = 0x48;
    do {
      piVar4 = *(int **)((long)&local_c8.refcount + lVar7);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          plVar5 = *(long **)((long)&local_c8.allocator + lVar7);
          if (plVar5 == (long *)0x0) {
            free(*(void **)((long)&local_c8.data + lVar7));
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&local_c8.cstep + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.refcount + lVar7 + 4) = 0;
      *(undefined8 *)((long)&local_c8.elemsize + lVar7 + 4) = 0;
      *(undefined8 *)((long)&local_c8.data + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.refcount + lVar7) = 0;
      *(undefined4 *)((long)&local_c8.c + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.dims + lVar7) = 0;
      *(undefined8 *)((long)&local_c8.h + lVar7) = 0;
      lVar7 = lVar7 + -0x48;
    } while (lVar7 != -0x48);
    ParamDict::~ParamDict(&pd);
    iVar8 = 0;
  }
  else {
    flatten((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + 2,&local_178,opt);
    iVar8 = -100;
    local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
    local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
    if ((local_178.data != (void *)0x0) &&
       (local_178.elemsize = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize),
       local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
       (long)local_178.c * local_178.cstep != 0)) {
      local_178.w = local_178.w * local_178.elempack;
      local_178.elemsize =
           CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) /
           (ulong)(long)local_178.elempack;
      local_178.elempack = 1;
      goto LAB_0022528a;
    }
  }
  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        free(local_178.data);
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00225724:
  piVar4 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        free(local_128.data);
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar8;
}

Assistant:

int Convolution_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.c * _weight_data.elempack;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(21, dilation_h);
    pd.set(3, stride_w);
    pd.set(31, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, pad_value);
    pd.set(5, bias_term);
    pd.set(6, weight_data_flattened.w);
    pd.set(8, int8_scale_term);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_flattened;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}